

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

int __thiscall
asl::Array<asl::Map<asl::String,_asl::String>::KeyVal>::remove
          (Array<asl::Map<asl::String,_asl::String>::KeyVal> *this,char *__filename)

{
  anon_union_16_2_78e7fdac_for_String_2 *paVar1;
  int iVar2;
  int iVar3;
  KeyVal *pKVar4;
  int in_EDX;
  long lVar5;
  
  pKVar4 = this->_a;
  iVar2 = *(int *)&pKVar4[-1].value.field_2;
  iVar3 = (int)__filename;
  if (in_EDX + iVar3 <= iVar2) {
    if (in_EDX != 0) {
      lVar5 = 0;
      do {
        if (*(int *)((long)&pKVar4[iVar3].value._size + lVar5) != 0) {
          ::free(*(void **)((long)&pKVar4[iVar3].value.field_2 + lVar5));
        }
        if (*(int *)((long)&pKVar4[iVar3].key._size + lVar5) != 0) {
          ::free(*(void **)((long)&pKVar4[iVar3].key.field_2 + lVar5));
        }
        lVar5 = lVar5 + 0x30;
      } while ((long)in_EDX * 0x30 != lVar5);
      pKVar4 = this->_a;
    }
    memmove(pKVar4 + iVar3,pKVar4 + iVar3 + in_EDX,(long)(iVar2 - (in_EDX + iVar3)) * 0x30);
    paVar1 = &this->_a[-1].value.field_2;
    *(int *)paVar1 = *(int *)paVar1 - in_EDX;
    resize(this,iVar2 - in_EDX);
  }
  return (int)this;
}

Assistant:

Array& remove(int i, int n = 1)
	{
		int m = d().n;
		if (i + n > m)
			return *this;
		asl_destroy(_a+i, n);
		memmove((char*)(_a + i), _a + i + n, (m - i - n)*sizeof(T));
		d().n -= n;
		resize(m - n);
		return *this;
	}